

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O3

void __thiscall
SimpleStringInternalCache::releaseNonCachedMemory
          (SimpleStringInternalCache *this,char *memory,size_t size)

{
  char *pcVar1;
  SimpleStringMemoryBlock *block;
  SimpleStringMemoryBlock *pSVar2;
  SimpleStringMemoryBlock *pSVar3;
  
  pSVar3 = this->nonCachedAllocations_;
  if (pSVar3 != (SimpleStringMemoryBlock *)0x0) {
    pcVar1 = pSVar3->memory_;
    if (pcVar1 == memory) {
      this->nonCachedAllocations_ = pSVar3->next_;
    }
    else {
      do {
        pSVar2 = pSVar3;
        pSVar3 = pSVar2->next_;
        if (pSVar3 == (SimpleStringMemoryBlock *)0x0) goto LAB_002b511c;
        pcVar1 = pSVar3->memory_;
      } while (pcVar1 != memory);
      pSVar2->next_ = pSVar3->next_;
    }
    (*this->allocator_->_vptr_TestMemoryAllocator[3])
              (this->allocator_,pcVar1,size,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
               ,0x6f);
    (*this->allocator_->_vptr_TestMemoryAllocator[3])
              (this->allocator_,pSVar3,0x10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
               ,0x70);
    return;
  }
LAB_002b511c:
  printDeallocatingUnknownMemory(this,memory);
  return;
}

Assistant:

void SimpleStringInternalCache::releaseNonCachedMemory(char* memory, size_t size)
{
    if (nonCachedAllocations_ && nonCachedAllocations_->memory_ == memory) {
        SimpleStringMemoryBlock* block = nonCachedAllocations_;
        nonCachedAllocations_ = block->next_;
        destroySimpleStringMemoryBlock(block, size);
        return;
    }

    for (SimpleStringMemoryBlock* block = nonCachedAllocations_; block; block = block->next_) {
        if (block->next_ && block->next_->memory_ == memory) {
            SimpleStringMemoryBlock* blockToFree = block->next_;
            block->next_ = block->next_->next_;
            destroySimpleStringMemoryBlock(blockToFree, size);
            return;
        }
    }

    printDeallocatingUnknownMemory(memory);
}